

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

int libwebvtt::Parser::ParseTime(string *line,size_type *idx_ptr,Time *time)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  bool have_milliseconds;
  char c_1;
  int first_val;
  Time *t;
  int val;
  char c;
  size_type *idx;
  Time *time_local;
  size_type *idx_ptr_local;
  string *line_local;
  
  if (idx_ptr == (size_type *)0x0) {
    line_local._4_4_ = -1;
  }
  else if ((*idx_ptr == 0xffffffffffffffff) ||
          (uVar2 = *idx_ptr, uVar4 = std::__cxx11::string::length(), uVar4 <= uVar2)) {
    line_local._4_4_ = -1;
  }
  else if (time == (Time *)0x0) {
    line_local._4_4_ = -1;
  }
  else {
    while( true ) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)line);
      cVar1 = *pcVar5;
      if ((cVar1 == '\0') || ((cVar1 != ' ' && (cVar1 != '\t')))) break;
      *idx_ptr = *idx_ptr + 1;
    }
    line_local._4_4_ = ParseNumber(line,idx_ptr);
    if (-1 < line_local._4_4_) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)line);
      if (*pcVar5 == ':') {
        *idx_ptr = *idx_ptr + 1;
        iVar3 = ParseNumber(line,idx_ptr);
        if (iVar3 < 0) {
          return iVar3;
        }
        if (0x3b < iVar3) {
          return -1;
        }
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)line);
        if (*pcVar5 == ':') {
          time->hours = line_local._4_4_;
          time->minutes = iVar3;
          *idx_ptr = *idx_ptr + 1;
          iVar3 = ParseNumber(line,idx_ptr);
          if (iVar3 < 0) {
            return iVar3;
          }
          if (0x3b < iVar3) {
            return -1;
          }
          time->seconds = iVar3;
        }
        else {
          if (0x3b < line_local._4_4_) {
            return -1;
          }
          time->hours = 0;
          time->minutes = line_local._4_4_;
          time->seconds = iVar3;
        }
      }
      else {
        time->seconds = line_local._4_4_;
        time->minutes = time->seconds / 0x3c;
        time->seconds = time->seconds + time->minutes * -0x3c;
        time->hours = time->minutes / 0x3c;
        time->minutes = time->minutes + time->hours * -0x3c;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)line);
      if (*pcVar5 == '.') {
        *idx_ptr = *idx_ptr + 1;
        iVar3 = ParseNumber(line,idx_ptr);
        if (iVar3 < 0) {
          return iVar3;
        }
        if (999 < iVar3) {
          return -1;
        }
        if (iVar3 < 10) {
          time->milliseconds = iVar3 * 100;
        }
        else if (iVar3 < 100) {
          time->milliseconds = iVar3 * 10;
        }
        else {
          time->milliseconds = iVar3;
        }
      }
      else {
        time->milliseconds = 0;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)line);
      cVar1 = *pcVar5;
      if (((cVar1 == '\0') || (cVar1 == ' ')) || (cVar1 == '\t')) {
        line_local._4_4_ = 0;
      }
      else {
        line_local._4_4_ = -1;
      }
    }
  }
  return line_local._4_4_;
}

Assistant:

int Parser::ParseTime(const std::string& line, std::string::size_type* idx_ptr,
                      Time* time) {
  if (idx_ptr == NULL)
    return -1;

  std::string::size_type& idx = *idx_ptr;

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  if (time == NULL)
    return -1;

  // Consume any whitespace that precedes the timestamp.

  while (char c = line[idx]) {
    if (c != kSPACE && c != kTAB)
      break;
    ++idx;
  }

  // WebVTT timestamp syntax comes in three flavors:
  //  SS[.sss]
  //  MM:SS[.sss]
  //  HH:MM:SS[.sss]

  // Parse a generic number value.  We don't know which component
  // of the time we have yet, until we do more parsing.

  int val = ParseNumber(line, &idx);

  if (val < 0)  // error
    return val;

  Time& t = *time;

  // The presence of a colon character indicates that we have
  // an [HH:]MM:SS style syntax.

  if (line[idx] == ':') {
    // We have either HH:MM:SS or MM:SS

    // The value we just parsed is either the hours or minutes.
    // It must be followed by another number value (that is
    // either minutes or seconds).

    const int first_val = val;

    ++idx;  // consume colon

    // Parse second value

    val = ParseNumber(line, &idx);

    if (val < 0)
      return val;

    if (val >= 60)  // either MM or SS
      return -1;

    if (line[idx] == ':') {
      // We have HH:MM:SS

      t.hours = first_val;
      t.minutes = val;  // vetted above

      ++idx;  // consume MM:SS colon

      // We have parsed the hours and minutes.
      // We must now parse the seconds.

      val = ParseNumber(line, &idx);

      if (val < 0)
        return val;

      if (val >= 60)  // SS part of HH:MM:SS
        return -1;

      t.seconds = val;
    } else {
      // We have MM:SS

      // The implication here is that the hour value was omitted
      // from the timestamp (because it was 0).

      if (first_val >= 60)  // minutes
        return -1;

      t.hours = 0;
      t.minutes = first_val;
      t.seconds = val;  // vetted above
    }
  } else {
    // We have SS (only)

    // The time is expressed as total number of seconds,
    // so the seconds value has no upper bound.

    t.seconds = val;

    // Convert SS to HH:MM:SS

    t.minutes = t.seconds / 60;
    t.seconds -= t.minutes * 60;

    t.hours = t.minutes / 60;
    t.minutes -= t.hours * 60;
  }

  // We have parsed the hours, minutes, and seconds.
  // We must now parse the milliseconds.

  char c = line[idx];

  // TODO(matthewjheaney): one option here is to slightly relax the
  // syntax rules for WebVTT timestamps, to permit the comma character
  // to also be used as the seconds/milliseconds separator.  This
  // would handle streams that use localization conventions for
  // countries in Western Europe.  For now we obey the rules specified
  // in the WebVTT spec (allow "full stop" only).

  const bool have_milliseconds = (c == '.');

  if (!have_milliseconds) {
    t.milliseconds = 0;
  } else {
    ++idx;  // consume FULL STOP

    val = ParseNumber(line, &idx);

    if (val < 0)
      return val;

    if (val >= 1000)
      return -1;

    if (val < 10)
      t.milliseconds = val * 100;
    else if (val < 100)
      t.milliseconds = val * 10;
    else
      t.milliseconds = val;
  }

  // We have parsed the time proper.  We must check for any
  // junk that immediately follows the time specifier.

  c = line[idx];

  if (c != kNUL && c != kSPACE && c != kTAB)
    return -1;

  return 0;  // success
}